

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O3

pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* UniqueObjectHelper<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,int index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_50;
  string local_30;
  
  UniqueObjectHelper<std::__cxx11::string>(&local_50,index);
  UniqueObjectHelper<std::__cxx11::string>(&local_30,index + 1);
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    paVar1->_M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         local_50.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = local_50._M_string_length;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    paVar1->_M_allocated_capacity = local_30.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         local_30.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = local_30._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

pair<const string, string> UniqueObjectHelper(int index) {
  return pair<const string, string>(UniqueObjectHelper<string>(index),
                                    UniqueObjectHelper<string>(index + 1));
}